

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

size_t linenoiseUtf8NextCharLen(char *buf,size_t buf_len,size_t pos,size_t *col_len)

{
  undefined8 in_RAX;
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  int cp;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  sVar1 = utf8BytesToCodePoint(buf + pos,buf_len - pos,(int *)((long)&uStack_38 + 4));
  uVar2 = (ulong)uStack_38._4_4_;
  lVar4 = 0;
  do {
    if (*(ulong *)((long)combiningCharTable + lVar4) == uVar2) {
      return 0;
    }
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x3cf0);
  if (col_len != (size_t *)0x0) {
    lVar4 = 8;
    do {
      if ((*(ulong *)((long)combiningCharTable + lVar4 + 0x3ce8) <= uVar2) &&
         (uVar2 <= *(ulong *)((long)wideCharTable[0] + lVar4))) {
        sVar3 = 2;
        goto LAB_0010cb99;
      }
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x798);
    sVar3 = 1;
LAB_0010cb99:
    *col_len = sVar3;
  }
  uVar2 = sVar1 + pos;
  if (uVar2 < buf_len) {
    do {
      sVar1 = utf8BytesToCodePoint(buf + uVar2,buf_len - uVar2,(int *)((long)&uStack_38 + 4));
      lVar4 = 0;
      while (*(long *)((long)combiningCharTable + lVar4) != (long)uStack_38._4_4_) {
        lVar4 = lVar4 + 8;
        if (lVar4 == 0x3cf0) goto LAB_0010cbe0;
      }
      uVar2 = uVar2 + sVar1;
    } while (uVar2 < buf_len);
  }
LAB_0010cbe0:
  return uVar2 - pos;
}

Assistant:

size_t linenoiseUtf8NextCharLen(const char* buf, size_t buf_len, size_t pos, size_t *col_len) {
    size_t beg = pos;
    int cp;
    size_t len = utf8BytesToCodePoint(buf + pos, buf_len - pos, &cp);
    if (isCombiningChar(cp)) {
        /* NOTREACHED */
        return 0;
    }
    if (col_len != NULL) *col_len = isWideChar(cp) ? 2 : 1;
    pos += len;
    while (pos < buf_len) {
        len = utf8BytesToCodePoint(buf + pos, buf_len - pos, &cp);
        if (!isCombiningChar(cp)) return pos - beg;
        pos += len;
    }
    return pos - beg;
}